

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

roaring_bitmap_t * roaring_bitmap_create_with_capacity(uint32_t cap)

{
  _Bool _Var1;
  roaring_array_t *new_ra;
  
  new_ra = (roaring_array_t *)malloc(0x28);
  if (new_ra != (roaring_array_t *)0x0) {
    _Var1 = ra_init_with_capacity(new_ra,cap);
    if (_Var1) {
      return (roaring_bitmap_t *)new_ra;
    }
    free(new_ra);
  }
  return (roaring_bitmap_t *)0x0;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_create_with_capacity(uint32_t cap) {
    roaring_bitmap_t *ans =
        (roaring_bitmap_t *)malloc(sizeof(roaring_bitmap_t));
    if (!ans) {
        return NULL;
    }
    bool is_ok = ra_init_with_capacity(&ans->high_low_container, cap);
    if (!is_ok) {
        free(ans);
        return NULL;
    }
    return ans;
}